

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateTypeidMemberAccess
          (ExpressionContext *ctx,SynBase *source,TypeBase *type,SynIdentifier *member)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined **ppuVar5;
  undefined4 extraout_var_02;
  TypeArgumentSet *this;
  ExprBase *pEVar6;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  TypeBase *pTVar7;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  TypeBase *pTVar8;
  _func_int **pp_Var9;
  InplaceStr *pIVar10;
  TypeRef *pTVar11;
  uint *puVar12;
  char **ppcVar13;
  long lVar14;
  TypeArray *arrType;
  InplaceStr IVar15;
  InplaceStr local_40;
  undefined4 extraout_var_03;
  
  if (member == (SynIdentifier *)0x0) {
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar3);
    pTVar7 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pEVar6->typeID = 1;
    pEVar6->source = source;
    pEVar6->type = pTVar7;
    pEVar6->next = (ExprBase *)0x0;
    pEVar6->listed = false;
    pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e38d8;
    pEVar6[1]._vptr_ExprBase = (_func_int **)type;
    return pEVar6;
  }
  if (type != (TypeBase *)0x0) {
    uVar4 = type->typeID;
    if (uVar4 == 0x18) {
      pIVar10 = (InplaceStr *)&type[2].refType;
      while (pTVar11 = (TypeRef *)pIVar10->begin, pTVar11 != (TypeRef *)0x0) {
        bVar2 = InplaceStr::operator==
                          ((InplaceStr *)((pTVar11->super_TypeBase)._vptr_TypeBase + 8),
                           &member->name);
        if (bVar2) goto LAB_001ca86e;
        pIVar10 = &(pTVar11->super_TypeBase).name;
      }
      pIVar10 = (InplaceStr *)&type[2].size;
      while (pTVar11 = (TypeRef *)pIVar10->begin, pTVar11 != (TypeRef *)0x0) {
        bVar2 = InplaceStr::operator==
                          ((InplaceStr *)((pTVar11->super_TypeBase)._vptr_TypeBase + 8),
                           &member->name);
        if (bVar2) goto LAB_001ca86e;
        pIVar10 = &(pTVar11->super_TypeBase).name;
      }
      uVar4 = type->typeID;
    }
    if ((uVar4 < 0x1a) && ((0x3130000U >> (uVar4 & 0x1f) & 1) != 0)) {
      pIVar10 = &member->name;
      puVar12 = &type[1].typeID;
      while (lVar14 = *(long *)puVar12, lVar14 != 0) {
        bVar2 = InplaceStr::operator==
                          ((InplaceStr *)(*(long *)(*(long *)(lVar14 + 8) + 0x28) + 0x40),pIVar10);
        if (bVar2) {
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pEVar6 = (ExprBase *)CONCAT44(extraout_var_01,iVar3);
          pTVar7 = ctx->typeTypeID;
          pTVar8 = *(TypeBase **)(*(long *)(lVar14 + 8) + 0x20);
          goto LAB_001ca929;
        }
        puVar12 = (uint *)(lVar14 + 0x18);
      }
      ppcVar13 = &type[1].name.end;
      while (plVar1 = (long *)*ppcVar13, plVar1 != (long *)0x0) {
        bVar2 = InplaceStr::operator==((InplaceStr *)(*plVar1 + 0x40),pIVar10);
        if (bVar2) {
          pEVar6 = CreateLiteralCopy(ctx,source,(ExprBase *)plVar1[1]);
          return pEVar6;
        }
        ppcVar13 = (char **)(plVar1 + 2);
      }
      local_40.begin = "hasMember";
      local_40.end = "";
      bVar2 = InplaceStr::operator==(pIVar10,&local_40);
      if (bVar2) {
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_02,iVar3);
        pTVar7 = ctx->typeTypeID;
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
        this = (TypeArgumentSet *)CONCAT44(extraout_var_03,iVar3);
        IVar15 = GetMemberSetTypeName(ctx,type);
        TypeMemberSet::TypeMemberSet((TypeMemberSet *)this,IVar15,(TypeStruct *)type);
        goto LAB_001ca9cd;
      }
      uVar4 = type->typeID;
    }
    if (uVar4 == 0x17) {
      lVar14 = *(long *)(type[1]._vptr_TypeBase[0x18] + 0x50);
      while (lVar14 != 0) {
        bVar2 = InplaceStr::operator==((InplaceStr *)(lVar14 + 0x40),&member->name);
        if (bVar2) {
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pEVar6 = (ExprBase *)CONCAT44(extraout_var_08,iVar3);
          pTVar7 = ctx->typeTypeID;
          pTVar8 = ctx->typeGeneric;
          goto LAB_001ca929;
        }
        lVar14 = *(long *)(lVar14 + 0x30);
        if ((lVar14 == 0) || (*(int *)(lVar14 + 8) != 4)) {
          lVar14 = 0;
        }
      }
    }
  }
  pIVar10 = &member->name;
  local_40.begin = "isReference";
  local_40.end = "";
  bVar2 = InplaceStr::operator==(pIVar10,&local_40);
  if (bVar2) {
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var_04,iVar3);
    pTVar7 = ctx->typeBool;
    if (type != (TypeBase *)0x0) {
      bVar2 = type->typeID == 0x12;
      goto LAB_001cab67;
    }
  }
  else {
    local_40.begin = "isArray";
    local_40.end = "";
    bVar2 = InplaceStr::operator==(pIVar10,&local_40);
    if (bVar2) {
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      pEVar6 = (ExprBase *)CONCAT44(extraout_var_05,iVar3);
      pTVar7 = ctx->typeBool;
      if (type != (TypeBase *)0x0) {
        bVar2 = true;
        if (type->typeID != 0x13) {
          bVar2 = type->typeID == 0x14;
        }
        goto LAB_001cab67;
      }
    }
    else {
      local_40.begin = "isFunction";
      local_40.end = "";
      bVar2 = InplaceStr::operator==(pIVar10,&local_40);
      if (!bVar2) {
        local_40.begin = "arraySize";
        local_40.end = "";
        bVar2 = InplaceStr::operator==(pIVar10,&local_40);
        if (bVar2) {
          if (type != (TypeBase *)0x0) {
            uVar4 = type->typeID;
            if (uVar4 == 0x14) {
              iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
              pEVar6 = (ExprBase *)CONCAT44(extraout_var_12,iVar3);
              pTVar7 = ctx->typeInt;
              pEVar6->typeID = 6;
              pEVar6->source = source;
              pEVar6->type = pTVar7;
              pEVar6->next = (ExprBase *)0x0;
              pEVar6->listed = false;
              pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e33d0;
              pEVar6[1]._vptr_ExprBase = (_func_int **)0xffffffffffffffff;
              return pEVar6;
            }
            if (uVar4 == 0x13) {
              iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
              pEVar6 = (ExprBase *)CONCAT44(extraout_var_11,iVar3);
              pTVar7 = ctx->typeInt;
              pTVar8 = *(TypeBase **)&type[1].typeID;
              pEVar6->typeID = 6;
              pEVar6->source = source;
              pEVar6->type = pTVar7;
              pEVar6->next = (ExprBase *)0x0;
              pEVar6->listed = false;
              ppuVar5 = &PTR__ExprBase_003e33d0;
              goto LAB_001ca94f;
            }
            if (uVar4 == 0) goto LAB_001cae3d;
          }
          anon_unknown.dwarf_ff84f::Report
                    (ctx,source,
                     "ERROR: \'arraySize\' can only be applied to an array type, but we have \'%.*s\'"
                     ,(ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
        }
        local_40.begin = "size";
        local_40.end = "";
        bVar2 = InplaceStr::operator==(pIVar10,&local_40);
        if (bVar2) {
          if (type != (TypeBase *)0x0) {
            if (type->typeID == 0x1b) {
              iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
              pEVar6 = (ExprBase *)CONCAT44(extraout_var_10,iVar3);
              pTVar7 = ctx->typeInt;
              uVar4 = IntrusiveList<TypeHandle>::size((IntrusiveList<TypeHandle> *)(type + 1));
              pEVar6->typeID = 6;
              pEVar6->source = source;
              pEVar6->type = pTVar7;
              pEVar6->next = (ExprBase *)0x0;
              pEVar6->listed = false;
              pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e33d0;
              pEVar6[1]._vptr_ExprBase = (_func_int **)(ulong)uVar4;
              return pEVar6;
            }
            if (type->typeID == 0) goto LAB_001cae3d;
          }
          anon_unknown.dwarf_ff84f::Report
                    (ctx,source,
                     "ERROR: \'size\' can only be applied to a function type, but we have \'%.*s\'",
                     (ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
        }
        local_40.begin = "argument";
        local_40.end = "";
        bVar2 = InplaceStr::operator==(pIVar10,&local_40);
        if (bVar2) {
          if (type != (TypeBase *)0x0) {
            if (type->typeID == 0x15) {
              iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
              pEVar6 = (ExprBase *)CONCAT44(extraout_var_13,iVar3);
              pTVar7 = ctx->typeTypeID;
              iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x70);
              this = (TypeArgumentSet *)CONCAT44(extraout_var_14,iVar3);
              IVar15 = GetArgumentSetTypeName(ctx,*(IntrusiveList<TypeHandle> *)&type[1].typeID);
              TypeArgumentSet::TypeArgumentSet
                        (this,IVar15,*(IntrusiveList<TypeHandle> *)&type[1].typeID);
LAB_001ca9cd:
              pEVar6->typeID = 8;
              pEVar6->source = source;
              pEVar6->type = pTVar7;
              pEVar6->next = (ExprBase *)0x0;
              pEVar6->listed = false;
              pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3558;
              pEVar6[1]._vptr_ExprBase = (_func_int **)this;
              return pEVar6;
            }
            if (type->typeID == 0) goto LAB_001cae3d;
          }
          anon_unknown.dwarf_ff84f::Report
                    (ctx,source,
                     "ERROR: \'argument\' can only be applied to a function type, but we have \'%.*s\'"
                     ,(ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
        }
        local_40.begin = "return";
        local_40.end = "";
        bVar2 = InplaceStr::operator==(pIVar10,&local_40);
        if (bVar2) {
          if (type == (TypeBase *)0x0) {
LAB_001cad0e:
            anon_unknown.dwarf_ff84f::Report
                      (ctx,source,
                       "ERROR: \'return\' can only be applied to a function type, but we have \'%.*s\'"
                       ,(ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
            goto LAB_001cad2d;
          }
          if (type->typeID != 0x15) {
            if (type->typeID == 0) goto LAB_001cae3d;
            goto LAB_001cad0e;
          }
LAB_001cae99:
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pEVar6 = (ExprBase *)CONCAT44(extraout_var_09,iVar3);
          pTVar7 = ctx->typeTypeID;
          pTVar8 = (TypeBase *)type[1]._vptr_TypeBase;
          goto LAB_001ca929;
        }
LAB_001cad2d:
        local_40.begin = "target";
        local_40.end = "";
        bVar2 = InplaceStr::operator==(pIVar10,&local_40);
        if (bVar2) {
          if (type != (TypeBase *)0x0) {
            uVar4 = type->typeID;
            if (uVar4 == 0x14) {
              iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
              pEVar6 = (ExprBase *)CONCAT44(extraout_var_16,iVar3);
              pTVar7 = ctx->typeTypeID;
              pTVar8 = *(TypeBase **)&type[1].typeIndex;
              goto LAB_001ca929;
            }
            if ((uVar4 == 0x12) || (uVar4 == 0x13)) goto LAB_001cae99;
            if (uVar4 == 0) goto LAB_001cae3d;
          }
          anon_unknown.dwarf_ff84f::Report
                    (ctx,source,
                     "ERROR: \'target\' can only be applied to a pointer or array type, but we have \'%.*s\'"
                     ,(ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
        }
        local_40.begin = "first";
        local_40.end = "";
        bVar2 = InplaceStr::operator==(pIVar10,&local_40);
        if (bVar2) {
          if (type == (TypeBase *)0x0) {
LAB_001cadda:
            anon_unknown.dwarf_ff84f::Report
                      (ctx,source,
                       "ERROR: \'first\' can only be applied to a function type, but we have \'%.*s\'"
                       ,(ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
            goto LAB_001cadf9;
          }
          if (type->typeID != 0x1b) {
            if (type->typeID == 0) goto LAB_001cae3d;
            goto LAB_001cadda;
          }
          if (type[1]._vptr_TypeBase == (_func_int **)0x0) goto LAB_001cb0a6;
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pEVar6 = (ExprBase *)CONCAT44(extraout_var_15,iVar3);
          pTVar7 = ctx->typeTypeID;
          pp_Var9 = type[1]._vptr_TypeBase;
        }
        else {
LAB_001cadf9:
          local_40.begin = "last";
          local_40.end = "";
          bVar2 = InplaceStr::operator==(pIVar10,&local_40);
          if (!bVar2) {
            return (ExprBase *)0x0;
          }
          if (type == (TypeBase *)0x0) {
LAB_001cafb0:
            anon_unknown.dwarf_ff84f::Report
                      (ctx,source,
                       "ERROR: \'last\' can only be applied to a function type, but we have \'%.*s\'"
                       ,(ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
            return (ExprBase *)0x0;
          }
          if (type->typeID != 0x1b) {
            if (type->typeID == 0) {
LAB_001cae3d:
              iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
              pTVar7 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
              ExprError::ExprError((ExprError *)CONCAT44(extraout_var_07,iVar3),source,pTVar7);
              return &((ExprError *)CONCAT44(extraout_var_07,iVar3))->super_ExprBase;
            }
            goto LAB_001cafb0;
          }
          if (type[1]._vptr_TypeBase == (_func_int **)0x0) {
LAB_001cb0a6:
            anon_unknown.dwarf_ff84f::Report(ctx,source,"ERROR: function argument set is empty");
            return (ExprBase *)0x0;
          }
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pEVar6 = (ExprBase *)CONCAT44(extraout_var_17,iVar3);
          pTVar7 = ctx->typeTypeID;
          pp_Var9 = *(_func_int ***)&type[1].typeID;
        }
        pTVar8 = (TypeBase *)*pp_Var9;
        goto LAB_001ca929;
      }
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      pEVar6 = (ExprBase *)CONCAT44(extraout_var_06,iVar3);
      pTVar7 = ctx->typeBool;
      if (type != (TypeBase *)0x0) {
        bVar2 = type->typeID == 0x15;
        goto LAB_001cab67;
      }
    }
  }
  bVar2 = false;
LAB_001cab67:
  pEVar6->typeID = 3;
  pEVar6->source = source;
  pEVar6->type = pTVar7;
  pEVar6->next = (ExprBase *)0x0;
  pEVar6->listed = false;
  pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3360;
  pEVar6->field_0x29 = bVar2;
  return pEVar6;
LAB_001ca86e:
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
  pEVar6 = (ExprBase *)CONCAT44(extraout_var_00,iVar3);
  pTVar7 = ctx->typeTypeID;
  pTVar8 = *(TypeBase **)&(pTVar11->super_TypeBase).typeID;
LAB_001ca929:
  pEVar6->typeID = 8;
  pEVar6->source = source;
  pEVar6->type = pTVar7;
  pEVar6->next = (ExprBase *)0x0;
  pEVar6->listed = false;
  ppuVar5 = &PTR__ExprBase_003e3558;
LAB_001ca94f:
  pEVar6->_vptr_ExprBase = (_func_int **)ppuVar5;
  pEVar6[1]._vptr_ExprBase = (_func_int **)pTVar8;
  return pEVar6;
}

Assistant:

ExprBase* CreateTypeidMemberAccess(ExpressionContext &ctx, SynBase *source, TypeBase *type, SynIdentifier *member)
{
	if(!member)
		return new (ctx.get<ExprErrorTypeMemberAccess>()) ExprErrorTypeMemberAccess(source, ctx.GetErrorType(), type);

	if(TypeClass *classType = getType<TypeClass>(type))
	{
		for(MatchData *curr = classType->aliases.head; curr; curr = curr->next)
		{
			if(curr->name->name== member->name)
				return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, curr->type);
		}

		for(MatchData *curr = classType->generics.head; curr; curr = curr->next)
		{
			if(curr->name->name == member->name)
				return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, curr->type);
		}
	}

	if(TypeStruct *structType = getType<TypeStruct>(type))
	{
		for(MemberHandle *curr = structType->members.head; curr; curr = curr->next)
		{
			if(curr->variable->name->name == member->name)
				return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, curr->variable->type);
		}

		for(ConstantData *curr = structType->constants.head; curr; curr = curr->next)
		{
			if(curr->name->name == member->name)
				return CreateLiteralCopy(ctx, source, curr->value);
		}

		if(member->name == InplaceStr("hasMember"))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, new (ctx.get<TypeMemberSet>()) TypeMemberSet(GetMemberSetTypeName(ctx, structType), structType));
	}

	if(TypeGenericClass *typeGenericClass = getType<TypeGenericClass>(type))
	{
		for(SynIdentifier *curr = typeGenericClass->proto->definition->aliases.head; curr; curr = getType<SynIdentifier>(curr->next))
		{
			if(curr->name == member->name)
				return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, ctx.typeGeneric);
		}
	}

	if(member->name == InplaceStr("isReference"))
	{
		return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.typeBool, isType<TypeRef>(type));
	}

	if(member->name == InplaceStr("isArray"))
	{
		return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.typeBool, isType<TypeArray>(type) || isType<TypeUnsizedArray>(type));
	}

	if(member->name == InplaceStr("isFunction"))
	{
		return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.typeBool, isType<TypeFunction>(type));
	}

	if(member->name == InplaceStr("arraySize"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeArray *arrType = getType<TypeArray>(type))
			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, arrType->length);

		if(isType<TypeUnsizedArray>(type))
			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, -1);

		Report(ctx, source, "ERROR: 'arraySize' can only be applied to an array type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("size"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeArgumentSet *argumentsType = getType<TypeArgumentSet>(type))
			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, argumentsType->types.size());

		Report(ctx, source, "ERROR: 'size' can only be applied to a function type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("argument"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeFunction *functionType = getType<TypeFunction>(type))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, new (ctx.get<TypeArgumentSet>()) TypeArgumentSet(GetArgumentSetTypeName(ctx, functionType->arguments), functionType->arguments));

		Report(ctx, source, "ERROR: 'argument' can only be applied to a function type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("return"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeFunction *functionType = getType<TypeFunction>(type))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, functionType->returnType);

		Report(ctx, source, "ERROR: 'return' can only be applied to a function type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("target"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeRef *refType = getType<TypeRef>(type))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, refType->subType);

		if(TypeArray *arrType = getType<TypeArray>(type))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, arrType->subType);

		if(TypeUnsizedArray *arrType = getType<TypeUnsizedArray>(type))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, arrType->subType);

		Report(ctx, source, "ERROR: 'target' can only be applied to a pointer or array type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("first"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeArgumentSet *argumentsType = getType<TypeArgumentSet>(type))
		{
			if(argumentsType->types.empty())
			{
				Report(ctx, source, "ERROR: function argument set is empty");

				return NULL;
			}

			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, argumentsType->types.head->type);
		}

		Report(ctx, source, "ERROR: 'first' can only be applied to a function type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("last"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeArgumentSet *argumentsType = getType<TypeArgumentSet>(type))
		{
			if(argumentsType->types.empty())
			{
				Report(ctx, source, "ERROR: function argument set is empty");

				return NULL;
			}

			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, argumentsType->types.tail->type);
		}

		Report(ctx, source, "ERROR: 'last' can only be applied to a function type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	return NULL;
}